

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# junit_log_formatter.hpp
# Opt level: O3

junit_log_helper * __thiscall
boost::unit_test::output::junit_log_formatter::get_current_log_entry(junit_log_formatter *this)

{
  _Rb_tree_header *p_Var1;
  _List_node_base *p_Var2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  
  if (((this->list_path_to_root).super__List_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&this->list_path_to_root)
     && (p_Var4 = (this->map_tests)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
        p_Var4 != (_Base_ptr)0x0)) {
    p_Var1 = &(this->map_tests)._M_t._M_impl.super__Rb_tree_header;
    p_Var2 = (this->list_path_to_root).
             super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl._M_node.
             super__List_node_base._M_prev[1]._M_next;
    p_Var3 = &p_Var1->_M_header;
    do {
      if (*(_List_node_base **)(p_Var4 + 1) >= p_Var2) {
        p_Var3 = p_Var4;
      }
      p_Var4 = (&p_Var4->_M_left)[*(_List_node_base **)(p_Var4 + 1) < p_Var2];
    } while (p_Var4 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var3 != p_Var1) && (*(_List_node_base **)(p_Var3 + 1) <= p_Var2)) {
      return (junit_log_helper *)&p_Var3[1]._M_parent;
    }
  }
  return &this->runner_log_entry;
}

Assistant:

junit_impl::junit_log_helper& get_current_log_entry() {
        if(list_path_to_root.empty())
            return runner_log_entry;
        map_trace_t::iterator it = map_tests.find(list_path_to_root.back());
        return (it == map_tests.end() ? runner_log_entry : it->second);
    }